

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_loopfilter.c
# Opt level: O3

void av1_filter_block_plane_horz_opt_chroma
               (AV1_COMMON *cm,MACROBLOCKD *xd,MACROBLOCKD_PLANE *plane_ptr,uint32_t mi_row,
               uint32_t mi_col,AV1_DEBLOCKING_PARAMETERS *params_buf,TX_SIZE *tx_buf,int plane,
               _Bool joint_filter_chroma,int num_mis_in_lpf_unit_height_log2)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  loop_filter_info_n *lfi_n;
  undefined1 use_filter_type;
  uint uVar3;
  uint uVar4;
  aom_bit_depth_t bd;
  MB_MODE_INFO *pMVar5;
  MB_MODE_INFO **ppMVar6;
  loop_filter_thresh *_blimit0;
  bool bVar7;
  uint16_t *s;
  byte bVar8;
  byte bVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  byte bVar13;
  byte bVar14;
  ulong uVar15;
  byte bVar16;
  int iVar17;
  int iVar18;
  uchar *s_00;
  uint uVar19;
  uint16_t *s_01;
  byte bVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  long lVar25;
  uint uVar26;
  uint8_t *dst_ptr;
  byte *pbVar27;
  uint8_t *puVar28;
  uint uVar29;
  int iVar30;
  MB_MODE_INFO *pMVar31;
  AV1_DEBLOCKING_PARAMETERS *pAVar32;
  ulong uVar24;
  
  uVar3 = plane_ptr->subsampling_x;
  uVar4 = plane_ptr->subsampling_y;
  bVar13 = (byte)uVar3;
  bVar14 = (byte)uVar4;
  iVar17 = (((1 << (bVar14 & 0x1f)) >> 1) + (((plane_ptr->dst).height << (bVar14 & 0x1f)) + 3 >> 2)
           >> (bVar14 & 0x1f)) - (mi_row >> (bVar14 & 0x1f));
  iVar30 = (1 << ((byte)num_mis_in_lpf_unit_height_log2 & 0x1f)) >> (bVar14 & 0x1f);
  if (iVar17 < iVar30) {
    iVar30 = iVar17;
  }
  uVar26 = (((1 << (bVar13 & 0x1f)) >> 1) + (((plane_ptr->dst).width << (bVar13 & 0x1f)) + 3 >> 2)
           >> (bVar13 & 0x1f)) - (mi_col >> (bVar13 & 0x1f));
  uVar19 = 0x20 >> (bVar13 & 0x1f);
  if ((int)uVar26 < (int)uVar19) {
    uVar19 = uVar26;
  }
  if (0 < (int)uVar19) {
    iVar17 = (plane_ptr->dst).stride;
    lVar25 = (long)((cm->mi_params).mi_stride << (bVar14 & 0x1f));
    uVar21 = (iVar30 << (bVar14 & 0x1f)) + mi_row;
    uVar22 = uVar4 | mi_row;
    lfi_n = &cm->lf_info;
    uVar26 = 0;
    do {
      params_buf->filter_length = '\0';
      uVar23 = (uVar26 << (bVar13 & 0x1f)) + mi_col | uVar3;
      uVar24 = (ulong)uVar23;
      ppMVar6 = (cm->mi_params).mi_grid_base + (cm->mi_params).mi_stride * uVar22 + uVar24;
      pMVar5 = *ppMVar6;
      if ((xd == (MACROBLOCKD *)0x0) || (xd->lossless[*(ushort *)&pMVar5->field_0xa7 & 7] == 0)) {
        if (plane == 0) {
          bVar16 = pMVar5->tx_size;
          if ((((pMVar5->field_0xa7 & 0x80) != 0) || ('\0' < pMVar5->ref_frame[0])) &&
             (pMVar5->skip_txfm == '\0')) {
            uVar12 = (ulong)pMVar5->bsize;
            bVar16 = pMVar5->inter_tx_size
                     [((int)("\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                             [uVar12] - 1 & uVar23) >>
                      (av1_get_txb_size_index_tw_w_log2_table[uVar12] & 0x1f)) +
                      (((int)("\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                              [uVar12] - 1 & uVar22) >>
                       (*(byte *)((long)&av1_get_txb_size_index_tw_h_log2_table + uVar12) & 0x1f))
                      << (av1_get_txb_size_index_stride_log2_table[uVar12] & 0x1f))];
          }
        }
        else {
          bVar20 = ""[av1_ss_size_lookup[pMVar5->bsize][(int)uVar3][(int)uVar4]];
          if (bVar20 < 0x11) {
            bVar16 = 3;
            if ((1 < bVar20 - 0xb) && (bVar20 != 4)) {
              bVar16 = bVar20;
            }
          }
          else if (bVar20 == 0x11) {
            bVar16 = 9;
          }
          else {
            bVar16 = bVar20;
            if (bVar20 == 0x12) {
              bVar16 = 10;
            }
          }
        }
        *tx_buf = bVar16;
        if (mi_row != 0) {
          pMVar31 = ppMVar6[-lVar25];
          if (xd != (MACROBLOCKD *)0x0) goto LAB_00396b38;
LAB_00396b54:
          if (plane == 0) {
            bVar9 = pMVar31->tx_size;
            if ((((pMVar31->field_0xa7 & 0x80) != 0) || ('\0' < pMVar31->ref_frame[0])) &&
               (pMVar31->skip_txfm == '\0')) {
              uVar12 = (ulong)pMVar31->bsize;
              bVar9 = pMVar31->inter_tx_size
                      [((int)("\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                              [uVar12] - 1 & uVar23) >>
                       (av1_get_txb_size_index_tw_w_log2_table[uVar12] & 0x1f)) +
                       (((int)("\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                               [uVar12] - 1 & (-1 << (bVar14 & 0x1f)) + uVar22) >>
                        (*(byte *)((long)&av1_get_txb_size_index_tw_h_log2_table + uVar12) & 0x1f))
                       << (av1_get_txb_size_index_stride_log2_table[uVar12] & 0x1f))];
            }
          }
          else {
            bVar9 = ""[av1_ss_size_lookup[pMVar31->bsize][(int)uVar3][(int)uVar4]];
            if (bVar9 < 0x11) {
              if ((bVar9 - 0xb < 2) || (bVar9 == 4)) {
                bVar9 = 3;
              }
            }
            else if (bVar9 == 0x11) {
              bVar9 = 9;
            }
            else if (bVar9 == 0x12) {
              bVar9 = 10;
            }
          }
          goto LAB_00396c44;
        }
        iVar18 = 0x40;
        bVar20 = bVar16;
      }
      else {
        *tx_buf = '\0';
        if (mi_row == 0) {
          iVar18 = 0x40;
          bVar16 = 0;
          bVar20 = bVar16;
        }
        else {
          pMVar31 = ppMVar6[-lVar25];
          bVar16 = 0;
LAB_00396b38:
          if (xd->lossless[*(ushort *)&pMVar31->field_0xa7 & 7] == 0) goto LAB_00396b54;
          bVar9 = 0;
LAB_00396c44:
          iVar18 = tx_size_wide[bVar9];
          bVar8 = get_filter_level(cm,lfi_n,1,plane,pMVar5);
          if (bVar8 == 0) {
            bVar8 = get_filter_level(cm,lfi_n,1,plane,pMVar31);
          }
          bVar7 = true;
          if ((pMVar31 == pMVar5) && (pMVar5->skip_txfm != '\0')) {
            if ((pMVar5->field_0xa7 & 0x80) == 0) {
              bVar7 = pMVar5->ref_frame[0] < '\x01';
            }
            else {
              bVar7 = false;
            }
          }
          bVar20 = bVar16;
          if ((!(bool)(pMVar31 == pMVar5 & (bVar7 ^ 1U))) && (bVar8 != 0)) {
            params_buf->filter_length = (uint8_t)horz_filter_length_chroma[bVar16][bVar9];
            params_buf->lfthr = (loop_filter_thresh *)(lfi_n->lfthr[0].mblim + (uint)bVar8 * 0x30);
            bVar20 = *tx_buf;
          }
        }
      }
      iVar11 = tx_size_wide[bVar16];
      if (iVar18 < tx_size_wide[bVar16]) {
        iVar11 = iVar18;
      }
      iVar18 = tx_size_high_unit[bVar20];
      uVar29 = (iVar18 << (bVar14 & 0x1f)) + mi_row;
      if (uVar29 < uVar21) {
        pbVar27 = tx_buf + iVar18;
        pAVar32 = params_buf + iVar18;
        do {
          pAVar32->filter_length = '\0';
          uVar10 = (cm->mi_params).mi_stride * (uVar4 | uVar29);
          ppMVar6 = (cm->mi_params).mi_grid_base;
          pMVar5 = ppMVar6[uVar10 + uVar24];
          if ((xd == (MACROBLOCKD *)0x0) || (xd->lossless[*(ushort *)&pMVar5->field_0xa7 & 7] == 0))
          {
            if (plane == 0) {
              bVar16 = pMVar5->tx_size;
              if ((((pMVar5->field_0xa7 & 0x80) != 0) || ('\0' < pMVar5->ref_frame[0])) &&
                 (pMVar5->skip_txfm == '\0')) {
                uVar12 = (ulong)pMVar5->bsize;
                bVar16 = pMVar5->inter_tx_size
                         [((int)("\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                                 [uVar12] - 1 & uVar23) >>
                          (av1_get_txb_size_index_tw_w_log2_table[uVar12] & 0x1f)) +
                          (((int)("\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                                  [uVar12] - 1 & (uVar4 | uVar29)) >>
                           (*(byte *)((long)&av1_get_txb_size_index_tw_h_log2_table + uVar12) & 0x1f
                           )) << (av1_get_txb_size_index_stride_log2_table[uVar12] & 0x1f))];
              }
            }
            else {
              bVar9 = ""[av1_ss_size_lookup[pMVar5->bsize][(int)uVar3][(int)uVar4]];
              if (bVar9 < 0x11) {
                bVar16 = 3;
                if ((1 < bVar9 - 0xb) && (bVar9 != 4)) {
                  bVar16 = bVar9;
                }
              }
              else if (bVar9 == 0x11) {
                bVar16 = 9;
              }
              else {
                bVar16 = bVar9;
                if (bVar9 == 0x12) {
                  bVar16 = 10;
                }
              }
            }
          }
          else {
            bVar16 = 0;
          }
          *pbVar27 = bVar16;
          pMVar31 = ppMVar6[(ulong)uVar10 + (uVar24 - lVar25)];
          bVar9 = get_filter_level(cm,lfi_n,1,plane,pMVar5);
          if (bVar9 == 0) {
            bVar9 = get_filter_level(cm,lfi_n,1,plane,pMVar31);
          }
          bVar7 = true;
          if ((pMVar31 == pMVar5) && (pMVar5->skip_txfm != '\0')) {
            if ((pMVar5->field_0xa7 & 0x80) == 0) {
              bVar7 = pMVar5->ref_frame[0] < '\x01';
            }
            else {
              bVar7 = false;
            }
          }
          uVar15 = (ulong)bVar16;
          uVar12 = uVar15;
          if ((bool)(bVar9 != 0 & (pMVar31 != pMVar5 | bVar7))) {
            pAVar32->filter_length = (uint8_t)horz_filter_length_chroma[uVar15][bVar20];
            pAVar32->lfthr = (loop_filter_thresh *)(lfi_n->lfthr[0].mblim + (uint)bVar9 * 0x30);
            uVar12 = (ulong)*pbVar27;
            bVar16 = *pbVar27;
          }
          bVar20 = bVar16;
          if (tx_size_wide[uVar15] <= iVar11) {
            iVar11 = tx_size_wide[uVar15];
          }
          iVar18 = tx_size_high_unit[uVar12];
          uVar29 = uVar29 + (iVar18 << (bVar14 & 0x1f));
          pbVar27 = pbVar27 + iVar18;
          pAVar32 = pAVar32 + iVar18;
        } while (uVar29 < uVar21);
      }
      if ((((uVar26 & 3) == 0) && ((int)(uVar26 | 3) < (int)uVar19)) && (0xf < iVar11)) {
        uVar29 = 2;
        uVar23 = 3;
      }
      else {
        uVar29 = 0;
        uVar23 = 0;
        if ((uVar26 & 1) == 0) {
          uVar29 = (uint)(7 < iVar11 && (int)(uVar26 | 1) < (int)uVar19);
          uVar23 = uVar29;
        }
      }
      if (0 < iVar30) {
        iVar18 = 0;
        pbVar27 = tx_buf;
        pAVar32 = params_buf;
        do {
          if (*pbVar27 == 0xff) {
            pAVar32->filter_length = '\0';
            *pbVar27 = 0;
          }
          iVar11 = iVar17 * 4 * iVar18 + uVar26 * 4;
          puVar28 = (plane_ptr->dst).buf + iVar11;
          if (joint_filter_chroma) {
            _blimit0 = pAVar32->lfthr;
            s_00 = plane_ptr[1].dst.buf + iVar11;
            if (cm->seq_params->use_highbitdepth == '\0') {
              uVar10 = pAVar32->filter_length - 4;
              uVar10 = uVar10 >> 1 | (uint)((uVar10 & 1) != 0) << 0x1f;
              if ((char)uVar29 == '\x01') {
                if (uVar10 == 1) {
                  puVar1 = _blimit0->lim;
                  puVar2 = _blimit0->hev_thr;
                  aom_lpf_horizontal_6_dual_sse2
                            (puVar28,iVar17,_blimit0->mblim,puVar1,puVar2,_blimit0->mblim,puVar1,
                             puVar2);
                  aom_lpf_horizontal_6_dual_sse2
                            (s_00,iVar17,_blimit0->mblim,puVar1,puVar2,_blimit0->mblim,puVar1,puVar2
                            );
                }
                else if (uVar10 == 0) {
                  puVar1 = _blimit0->lim;
                  puVar2 = _blimit0->hev_thr;
                  aom_lpf_horizontal_4_dual_sse2
                            (puVar28,iVar17,_blimit0->mblim,puVar1,puVar2,_blimit0->mblim,puVar1,
                             puVar2);
                  aom_lpf_horizontal_4_dual_sse2
                            (s_00,iVar17,_blimit0->mblim,puVar1,puVar2,_blimit0->mblim,puVar1,puVar2
                            );
                }
              }
              else if (uVar29 == 2) {
                if (uVar10 == 1) {
                  (*aom_lpf_horizontal_6_quad)
                            (puVar28,iVar17,_blimit0->mblim,_blimit0->lim,_blimit0->hev_thr);
                  (*aom_lpf_horizontal_6_quad)
                            (s_00,iVar17,_blimit0->mblim,_blimit0->lim,_blimit0->hev_thr);
                }
                else if (uVar10 == 0) {
                  aom_lpf_horizontal_4_quad_sse2
                            (puVar28,iVar17,_blimit0->mblim,_blimit0->lim,_blimit0->hev_thr);
                  aom_lpf_horizontal_4_quad_sse2
                            (s_00,iVar17,_blimit0->mblim,_blimit0->lim,_blimit0->hev_thr);
                }
              }
              else if (uVar10 == 1) {
                aom_lpf_horizontal_6_sse2
                          (puVar28,iVar17,_blimit0->mblim,_blimit0->lim,_blimit0->hev_thr);
                aom_lpf_horizontal_6_sse2
                          (s_00,iVar17,_blimit0->mblim,_blimit0->lim,_blimit0->hev_thr);
              }
              else if (uVar10 == 0) {
                aom_lpf_horizontal_4_sse2
                          (puVar28,iVar17,_blimit0->mblim,_blimit0->lim,_blimit0->hev_thr);
                aom_lpf_horizontal_4_sse2
                          (s_00,iVar17,_blimit0->mblim,_blimit0->lim,_blimit0->hev_thr);
              }
            }
            else {
              bd = cm->seq_params->bit_depth;
              s = (uint16_t *)((long)puVar28 * 2);
              s_01 = (uint16_t *)((long)s_00 * 2);
              uVar10 = pAVar32->filter_length - 4;
              uVar10 = uVar10 >> 1 | (uint)((uVar10 & 1) != 0) << 0x1f;
              if ((char)uVar29 == '\x01') {
                if (uVar10 == 1) {
                  aom_highbd_lpf_horizontal_6_dual_sse2
                            (s,iVar17,_blimit0->mblim,_blimit0->lim,_blimit0->hev_thr,
                             _blimit0->mblim,_blimit0->lim,_blimit0->hev_thr,bd);
LAB_00397525:
                  aom_highbd_lpf_horizontal_6_dual_sse2
                            (s_01,iVar17,_blimit0->mblim,_blimit0->lim,_blimit0->hev_thr,
                             _blimit0->mblim,_blimit0->lim,_blimit0->hev_thr,bd);
                }
                else if (uVar10 == 0) {
                  (*aom_highbd_lpf_horizontal_4_dual)
                            (s,iVar17,_blimit0->mblim,_blimit0->lim,_blimit0->hev_thr,
                             _blimit0->mblim,_blimit0->lim,_blimit0->hev_thr,bd);
LAB_003972de:
                  (*aom_highbd_lpf_horizontal_4_dual)
                            (s_01,iVar17,_blimit0->mblim,_blimit0->lim,_blimit0->hev_thr,
                             _blimit0->mblim,_blimit0->lim,_blimit0->hev_thr,bd);
                }
              }
              else if (uVar29 == 2) {
                if (uVar10 == 1) {
                  puVar28 = _blimit0->lim;
                  puVar1 = _blimit0->hev_thr;
                  aom_highbd_lpf_horizontal_6_dual_sse2
                            (s,iVar17,_blimit0->mblim,puVar28,puVar1,_blimit0->mblim,puVar28,puVar1,
                             bd);
                  aom_highbd_lpf_horizontal_6_dual_sse2
                            (s + 8,iVar17,_blimit0->mblim,puVar28,puVar1,_blimit0->mblim,puVar28,
                             puVar1,bd);
                  aom_highbd_lpf_horizontal_6_dual_sse2
                            (s_01,iVar17,_blimit0->mblim,puVar28,puVar1,_blimit0->mblim,puVar28,
                             puVar1,bd);
                  s_01 = s_01 + 8;
                  goto LAB_00397525;
                }
                if (uVar10 == 0) {
                  puVar28 = _blimit0->lim;
                  puVar1 = _blimit0->hev_thr;
                  (*aom_highbd_lpf_horizontal_4_dual)
                            (s,iVar17,_blimit0->mblim,puVar28,puVar1,_blimit0->mblim,puVar28,puVar1,
                             bd);
                  (*aom_highbd_lpf_horizontal_4_dual)
                            (s + 8,iVar17,_blimit0->mblim,puVar28,puVar1,_blimit0->mblim,puVar28,
                             puVar1,bd);
                  (*aom_highbd_lpf_horizontal_4_dual)
                            (s_01,iVar17,_blimit0->mblim,puVar28,puVar1,_blimit0->mblim,puVar28,
                             puVar1,bd);
                  s_01 = s_01 + 8;
                  goto LAB_003972de;
                }
              }
              else if (uVar10 == 1) {
                aom_highbd_lpf_horizontal_6_sse2
                          (s,iVar17,_blimit0->mblim,_blimit0->lim,_blimit0->hev_thr,bd);
                aom_highbd_lpf_horizontal_6_sse2
                          (s_01,iVar17,_blimit0->mblim,_blimit0->lim,_blimit0->hev_thr,bd);
              }
              else if (uVar10 == 0) {
                aom_highbd_lpf_horizontal_4_sse2
                          (s,iVar17,_blimit0->mblim,_blimit0->lim,_blimit0->hev_thr,bd);
                aom_highbd_lpf_horizontal_4_sse2
                          (s_01,iVar17,_blimit0->mblim,_blimit0->lim,_blimit0->hev_thr,bd);
              }
            }
          }
          else {
            use_filter_type = cm->seq_params->use_highbitdepth;
            filter_horz(puVar28,iVar17,pAVar32,(SequenceHeader *)(ulong)cm->seq_params->bit_depth,
                        use_filter_type);
          }
          iVar11 = tx_size_high_unit[*pbVar27];
          iVar18 = iVar18 + iVar11;
          pbVar27 = pbVar27 + iVar11;
          pAVar32 = pAVar32 + iVar11;
        } while (iVar18 < iVar30);
      }
      uVar26 = uVar26 + uVar23 + 1;
    } while ((int)uVar26 < (int)uVar19);
  }
  return;
}

Assistant:

void av1_filter_block_plane_horz_opt_chroma(
    const AV1_COMMON *const cm, const MACROBLOCKD *const xd,
    const MACROBLOCKD_PLANE *const plane_ptr, const uint32_t mi_row,
    const uint32_t mi_col, AV1_DEBLOCKING_PARAMETERS *params_buf,
    TX_SIZE *tx_buf, int plane, bool joint_filter_chroma,
    int num_mis_in_lpf_unit_height_log2) {
  const uint32_t scale_horz = plane_ptr->subsampling_x;
  const uint32_t scale_vert = plane_ptr->subsampling_y;
  const int dst_stride = plane_ptr->dst.stride;
  // Ensure that mi_cols/mi_rows are calculated based on frame dimension aligned
  // to MI_SIZE.
  const int mi_cols =
      ((plane_ptr->dst.width << scale_horz) + MI_SIZE - 1) >> MI_SIZE_LOG2;
  const int mi_rows =
      ((plane_ptr->dst.height << scale_vert) + MI_SIZE - 1) >> MI_SIZE_LOG2;
  const int plane_mi_rows = ROUND_POWER_OF_TWO(mi_rows, scale_vert);
  const int plane_mi_cols = ROUND_POWER_OF_TWO(mi_cols, scale_horz);
  const int y_range =
      AOMMIN((int)(plane_mi_rows - (mi_row >> scale_vert)),
             ((1 << num_mis_in_lpf_unit_height_log2) >> scale_vert));
  const int x_range = AOMMIN((int)(plane_mi_cols - (mi_col >> scale_horz)),
                             (MAX_MIB_SIZE >> scale_horz));
  const ptrdiff_t mode_step = cm->mi_params.mi_stride << scale_vert;
  for (int x = 0; x < x_range; x++) {
    const uint32_t y_start = mi_row + (0 << scale_vert);
    const uint32_t curr_x = mi_col + (x << scale_horz);
    const uint32_t y_end = mi_row + (y_range << scale_vert);
    int min_width = tx_size_wide[TX_64X64];
    set_lpf_parameters_for_line_chroma(params_buf, tx_buf, cm, xd, HORZ_EDGE,
                                       curr_x, y_start, plane_ptr, y_end,
                                       mode_step, scale_horz, scale_vert,
                                       &min_width, plane, joint_filter_chroma);

    AV1_DEBLOCKING_PARAMETERS *params = params_buf;
    TX_SIZE *tx_size = tx_buf;
    USE_FILTER_TYPE use_filter_type = USE_SINGLE;
    int x_inc = 0;

    if ((x & 3) == 0 && (x + 3) < x_range && min_width >= 16) {
      // If we are on a col which is a multiple of 4, and the minimum width is
      // 16 pixels, then the current and right 3 cols must contain the same tx
      // block. This is because dim 16 can only happen every unit of 4 mi's.
      use_filter_type = USE_QUAD;
      x_inc = 3;
    } else if (x % 2 == 0 && (x + 1) < x_range && min_width >= 8) {
      // If we are on an even col, and the minimum width is 8 pixels, then the
      // current and left cols must contain the same tx block. This is because
      // dim 4 can only happen every unit of 2**0, and 8 every unit of 2**1,
      // etc.
      use_filter_type = USE_DUAL;
      x_inc = 1;
    }

    for (int y = 0; y < y_range;) {
      // inner loop always filter vertical edges in a MI block. If MI size
      // is 8x8, it will first filter the vertical edge aligned with a 8x8
      // block. If 4x4 transform is used, it will then filter the internal
      // edge aligned with a 4x4 block
      if (*tx_size == TX_INVALID) {
        params->filter_length = 0;
        *tx_size = TX_4X4;
      }

      const int offset = y * MI_SIZE * dst_stride + x * MI_SIZE;
      if (joint_filter_chroma) {
        uint8_t *u_dst = plane_ptr[0].dst.buf + offset;
        uint8_t *v_dst = plane_ptr[1].dst.buf + offset;
        filter_horz_chroma(u_dst, v_dst, dst_stride, params, cm->seq_params,
                           use_filter_type);
      } else {
        uint8_t *dst_ptr = plane_ptr->dst.buf + offset;
        filter_horz(dst_ptr, dst_stride, params, cm->seq_params,
                    use_filter_type);
      }

      // advance the destination pointer
      const int advance_units = tx_size_high_unit[*tx_size];
      y += advance_units;
      params += advance_units;
      tx_size += advance_units;
    }
    x += x_inc;
  }
}